

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O1

QByteArray * __thiscall Preamble::get(QByteArray *__return_storage_ptr__,Preamble *this,QString *fn)

{
  long lVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  char *pcVar4;
  qsizetype qVar5;
  char cVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QArrayData *local_70;
  undefined8 *local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  char *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->m_str).d.size;
  if (lVar1 == 0) {
    local_38 = 0xaaaaaaaaaaaaaaaa;
    uStack_30 = 0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_38,fn);
    cVar6 = QFile::open((QFile *)&local_38,0x11);
    if (cVar6 == '\0') {
      local_58 = 2;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_48 = 0;
      uStack_44 = 0;
      local_40 = "default";
      QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)(fn->d).ptr);
      if (local_68 == (undefined8 *)0x0) {
        local_68 = &QByteArray::_empty;
      }
      QMessageLogger::warning((char *)&local_58,"Failed to open %s",local_68);
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70,1,0x10);
        }
      }
    }
    else {
      QIODevice::readAll();
      pQVar3 = &((this->m_str).d.d)->super_QArrayData;
      pcVar4 = (this->m_str).d.ptr;
      pDVar2 = (Data *)CONCAT44(uStack_54,local_58);
      local_58 = SUB84(pQVar3,0);
      uStack_54 = (undefined4)((ulong)pQVar3 >> 0x20);
      (this->m_str).d.d = pDVar2;
      (this->m_str).d.ptr = (char *)CONCAT44(uStack_4c,uStack_50);
      uStack_50 = SUB84(pcVar4,0);
      uStack_4c = (undefined4)((ulong)pcVar4 >> 0x20);
      qVar5 = (this->m_str).d.size;
      (this->m_str).d.size = CONCAT44(uStack_44,local_48);
      local_48 = (undefined4)qVar5;
      uStack_44 = (undefined4)((ulong)qVar5 >> 0x20);
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,1,0x10);
        }
      }
      QVar7.m_data = (storage_type *)0x3;
      QVar7.m_size = (qsizetype)this;
      QVar8.m_data = (storage_type *)0x5;
      QVar8.m_size = (qsizetype)"FOO";
      QByteArray::replace(QVar7,QVar8);
      QVar9.m_data = (storage_type *)0x41;
      QVar9.m_size = (this->m_str).d.size;
      QByteArray::insert((longlong)this,QVar9);
    }
    pDVar2 = (this->m_str).d.d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (this->m_str).d.ptr;
    (__return_storage_ptr__->d).size = (this->m_str).d.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QFile::~QFile((QFile *)&local_38);
  }
  else {
    pDVar2 = (this->m_str).d.d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (this->m_str).d.ptr;
    (__return_storage_ptr__->d).size = lVar1;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray Preamble::get(const QString &fn)
{
    if (!m_str.isEmpty())
        return m_str;

    QFile f(fn);
    if (!f.open(QIODevice::ReadOnly | QIODevice::Text)) {
        qWarning("Failed to open %s", qPrintable(fn));
        return m_str;
    }

    m_str = f.readAll();
    m_str.replace("FOO", "QtGui");
    m_str += "\n// This file is automatically generated by qvkgen. Do not edit.\n";

    return m_str;
}